

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_skill.cpp
# Opt level: O2

double G_SkillProperty(EFSkillProperty prop)

{
  double *pdVar1;
  double dVar2;
  
  dVar2 = 0.0;
  if (AllSkills.Count != 0) {
    switch(prop) {
    case SKILLP_AmmoFactor:
      if (((byte)dmflags2.Value & 0x40) == 0) {
        pdVar1 = &AllSkills.Array[gameskill.Value].AmmoFactor;
      }
      else {
        pdVar1 = &AllSkills.Array[gameskill.Value].DoubleAmmoFactor;
      }
      break;
    case SKILLP_DropAmmoFactor:
      pdVar1 = &AllSkills.Array[gameskill.Value].DropAmmoFactor;
      break;
    case SKILLP_ArmorFactor:
      pdVar1 = &AllSkills.Array[gameskill.Value].ArmorFactor;
      break;
    case SKILLP_HealthFactor:
      pdVar1 = &AllSkills.Array[gameskill.Value].HealthFactor;
      break;
    case SKILLP_DamageFactor:
      pdVar1 = &AllSkills.Array[gameskill.Value].DamageFactor;
      break;
    case SKILLP_Aggressiveness:
      pdVar1 = &AllSkills.Array[gameskill.Value].Aggressiveness;
      break;
    case SKILLP_MonsterHealth:
      pdVar1 = &AllSkills.Array[gameskill.Value].MonsterHealth;
      break;
    case SKILLP_FriendlyHealth:
      pdVar1 = &AllSkills.Array[gameskill.Value].FriendlyHealth;
      break;
    default:
      goto switchD_004615f2_default;
    }
    dVar2 = *pdVar1;
  }
switchD_004615f2_default:
  return dVar2;
}

Assistant:

double G_SkillProperty(EFSkillProperty prop)
{
	if (AllSkills.Size() > 0)
	{
		switch (prop)
		{
		case SKILLP_AmmoFactor:
			if (dmflags2 & DF2_YES_DOUBLEAMMO)
			{
				return AllSkills[gameskill].DoubleAmmoFactor;
			}
			return AllSkills[gameskill].AmmoFactor;

		case SKILLP_DropAmmoFactor:
			return AllSkills[gameskill].DropAmmoFactor;

		case SKILLP_ArmorFactor:
			return AllSkills[gameskill].ArmorFactor;

		case SKILLP_HealthFactor:
			return AllSkills[gameskill].HealthFactor;

		case SKILLP_DamageFactor:
			return AllSkills[gameskill].DamageFactor;

		case SKILLP_Aggressiveness:
			return AllSkills[gameskill].Aggressiveness;

		case SKILLP_MonsterHealth:
			return AllSkills[gameskill].MonsterHealth;

		case SKILLP_FriendlyHealth:
			return AllSkills[gameskill].FriendlyHealth;

		}
	}
	return 0;
}